

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_test.c
# Opt level: O3

void test_pull_recv_nonblock(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_socket local_34;
  nng_aio *pnStack_30;
  nng_socket s;
  nng_aio *aio;
  
  nVar1 = nng_pull0_open(&local_34);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pipeline0/pull_test.c"
                         ,0xdf,"%s: expected success, got %s (%d)","nng_pull0_open(&s)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_aio_alloc(&stack0xffffffffffffffd0,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pipeline0/pull_test.c"
                           ,0xe0,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio, NULL, NULL)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nng_aio_set_timeout(pnStack_30,0);
      nng_socket_recv(local_34,pnStack_30);
      nng_aio_wait(pnStack_30);
      nVar1 = nng_aio_result(pnStack_30);
      pcVar3 = nng_strerror(NNG_ETIMEDOUT);
      acutest_check_((uint)(nVar1 == NNG_ETIMEDOUT),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pipeline0/pull_test.c"
                     ,0xe6,"%s fails with %s","nng_aio_result(aio)",pcVar3);
      pcVar3 = nng_strerror(NNG_ETIMEDOUT);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,5,pcVar4,
                       (ulong)nVar1);
      nVar1 = nng_socket_close(local_34);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pipeline0/pull_test.c"
                             ,0xe7,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3,
                             nVar1);
      if (iVar2 != 0) {
        nng_aio_free(pnStack_30);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_pull_recv_nonblock(void)
{
	nng_socket s;
	nng_aio   *aio;

	NUTS_PASS(nng_pull0_open(&s));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));

	nng_aio_set_timeout(aio, 0); // Instant timeout
	nng_socket_recv(s, aio);

	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ETIMEDOUT);
	NUTS_CLOSE(s);
	nng_aio_free(aio);
}